

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool absl::lts_20240722::debugging_internal::ParsePrefix(State *state)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  
  iVar5 = state->recursion_depth;
  iVar1 = state->steps;
  state->recursion_depth = iVar5 + 1;
  state->steps = iVar1 + 1;
  if (iVar1 < 0x20000 && iVar5 < 0x100) {
    bVar3 = false;
LAB_00103171:
    if (0x1ffff < *(int *)&(state->parse_state).field_0xc * 2) {
      MaybeAppend(state,"::");
    }
    bVar2 = ParseTemplateParam(state);
    if (!bVar2) {
      bVar2 = ParseDecltype(state);
      if (!bVar2) {
        bVar2 = ParseSubstitution(state,true);
        if (!bVar2) {
          bVar2 = ParseVendorExtendedType(state);
          if (!bVar2) {
            bVar2 = ParseUnscopedName(state);
            if (!bVar2) {
              bVar2 = ParseOneCharToken(state,'M');
              if (!bVar2) goto LAB_0010320f;
              bVar2 = ParseUnnamedTypeName(state);
              if (!bVar2) goto LAB_0010320f;
            }
          }
        }
      }
    }
    uVar4 = *(uint *)&(state->parse_state).field_0xc;
    iVar5 = (int)(uVar4 * 2) >> 0x11;
    bVar3 = true;
    if (-1 < iVar5) {
      *(uint *)&(state->parse_state).field_0xc = (uVar4 & 0x8000ffff) + iVar5 * 0x10000 + 0x10000;
    }
    goto LAB_00103171;
  }
  bVar2 = false;
LAB_0010325c:
  state->recursion_depth = state->recursion_depth + -1;
  return bVar2;
LAB_0010320f:
  iVar5 = *(int *)&(state->parse_state).field_0xc;
  if ((iVar5 < 0 && 0x1ffff < iVar5 * 2) && (iVar5 = (state->parse_state).out_cur_idx, 1 < iVar5)) {
    uVar4 = iVar5 - 2;
    (state->parse_state).out_cur_idx = uVar4;
    state->out[uVar4] = '\0';
  }
  bVar2 = true;
  if (bVar3) {
    bVar3 = ParseTemplateArgs(state);
    if (bVar3) {
      bVar2 = ParsePrefix(state);
    }
  }
  goto LAB_0010325c;
}

Assistant:

static bool ParsePrefix(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  bool has_something = false;
  while (true) {
    MaybeAppendSeparator(state);
    if (ParseTemplateParam(state) || ParseDecltype(state) ||
        ParseSubstitution(state, /*accept_std=*/true) ||
        // Although the official grammar does not mention it, nested-names
        // shaped like Nu14__some_builtinIiE6memberE occur in practice, and it
        // is not clear what else a compiler is supposed to do when a
        // vendor-extended type has named members.
        ParseVendorExtendedType(state) ||
        ParseUnscopedName(state) ||
        (ParseOneCharToken(state, 'M') && ParseUnnamedTypeName(state))) {
      has_something = true;
      MaybeIncreaseNestLevel(state);
      continue;
    }
    MaybeCancelLastSeparator(state);
    if (has_something && ParseTemplateArgs(state)) {
      return ParsePrefix(state);
    } else {
      break;
    }
  }
  return true;
}